

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O1

void __thiscall SymbolTable::addGlobalSymbol(SymbolTable *this,SleighSymbol *a)

{
  pointer *pppSVar1;
  iterator __position;
  SymbolScope *pSVar2;
  _Base_ptr p_Var3;
  LowlevelError *this_00;
  long *plVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pair<std::_Rb_tree_iterator<SleighSymbol_*>,_bool> pVar6;
  SleighSymbol *local_68;
  _Alloc_hider local_60;
  _Base_ptr local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __position._M_current =
       (this->symbollist).super__Vector_base<SleighSymbol_*,_std::allocator<SleighSymbol_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  a->id = (uintm)((ulong)((long)__position._M_current -
                         (long)(this->symbollist).
                               super__Vector_base<SleighSymbol_*,_std::allocator<SleighSymbol_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_68 = a;
  if (__position._M_current ==
      (this->symbollist).super__Vector_base<SleighSymbol_*,_std::allocator<SleighSymbol_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<SleighSymbol*,std::allocator<SleighSymbol*>>::_M_realloc_insert<SleighSymbol*const&>
              ((vector<SleighSymbol*,std::allocator<SleighSymbol*>> *)this,__position,&local_68);
  }
  else {
    *__position._M_current = a;
    pppSVar1 = &(this->symbollist).
                super__Vector_base<SleighSymbol_*,_std::allocator<SleighSymbol_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  pSVar2 = *(this->table).super__Vector_base<SymbolScope_*,_std::allocator<SymbolScope_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_68->scopeid = pSVar2->id;
  local_60._M_p = (pointer)local_68;
  pVar6 = std::
          _Rb_tree<SleighSymbol*,SleighSymbol*,std::_Identity<SleighSymbol*>,SymbolCompare,std::allocator<SleighSymbol*>>
          ::_M_insert_unique<SleighSymbol*const&>
                    ((_Rb_tree<SleighSymbol*,SleighSymbol*,std::_Identity<SleighSymbol*>,SymbolCompare,std::allocator<SleighSymbol*>>
                      *)&pSVar2->tree,(SleighSymbol **)&local_60);
  p_Var3 = pVar6.first._M_node._M_node + 1;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    p_Var3 = (_Base_ptr)&local_60;
  }
  if ((SleighSymbol *)*(pointer *)p_Var3 == local_68) {
    return;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::operator+(&local_40,"Duplicate symbol name \'",&local_68->name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60._M_p = (pointer)*plVar4;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p == paVar5) {
    local_50._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_50._8_8_ = plVar4[3];
    local_60._M_p = (pointer)&local_50;
  }
  else {
    local_50._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_58 = (_Base_ptr)plVar4[1];
  *plVar4 = (long)paVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  LowlevelError::LowlevelError(this_00,(string *)&local_60);
  __cxa_throw(this_00,&SleighError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void SymbolTable::addGlobalSymbol(SleighSymbol *a)

{
  a->id = symbollist.size();
  symbollist.push_back(a);
  SymbolScope *scope = getGlobalScope();
  a->scopeid = scope->getId();
  SleighSymbol *res = scope->addSymbol(a);
  if (res != a)
    throw SleighError("Duplicate symbol name '" + a->getName() + "'");
}